

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# least.cpp
# Opt level: O3

void duckdb::LeastGreatestFunction<duckdb::string_t,duckdb::LessThan,duckdb::SortKeyLeastGreatest>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  undefined8 *puVar1;
  long lVar2;
  long lVar3;
  string_t *psVar4;
  optional_ptr<duckdb::FunctionLocalState,_true> oVar5;
  bool bVar6;
  DataChunk *this;
  reference pvVar7;
  ulong uVar8;
  string_t *psVar9;
  ulong uVar10;
  ulong uVar11;
  size_type sVar12;
  string_t ivalue;
  UnifiedVectorFormat vdata;
  bool result_has_value [2048];
  anon_union_16_2_67f50693_for_value local_8a8;
  Vector *local_890;
  ExpressionState *local_888;
  long *local_880;
  long local_878;
  long local_870;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_860;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_840;
  optional_ptr<duckdb::FunctionLocalState,_true> local_838 [257];
  
  if (*(long *)(args + 8) - *(long *)args == 0x68) {
    vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,0);
    duckdb::Vector::Reference(result);
    return;
  }
  this = SortKeyLeastGreatest::Prepare(args,state);
  local_838[0].ptr = *(FunctionLocalState **)(state + 0xb0);
  local_888 = state;
  optional_ptr<duckdb::FunctionLocalState,_true>::CheckValid(local_838);
  oVar5.ptr = local_838[0].ptr;
  if (*(long *)(this + 8) == *(long *)this) {
    memset(local_838,0,0x800);
  }
  else {
    sVar12 = 0;
    local_890 = result;
    do {
      vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,sVar12);
      sVar12 = sVar12 + 1;
      lVar2 = *(long *)this;
      lVar3 = *(long *)(this + 8);
    } while (sVar12 < (ulong)((lVar3 - lVar2 >> 3) * 0x4ec4ec4ec4ec4ec5));
    psVar4 = *(string_t **)(oVar5.ptr + 0x68);
    memset(local_838,0,0x800);
    result = local_890;
    if (lVar3 != lVar2) {
      sVar12 = 0;
      do {
        pvVar7 = vector<duckdb::Vector,_true>::operator[]
                           ((vector<duckdb::Vector,_true> *)this,sVar12);
        if (*pvVar7 == (value_type)0x2) {
          pvVar7 = vector<duckdb::Vector,_true>::operator[]
                             ((vector<duckdb::Vector,_true> *)this,sVar12);
          if ((*(byte **)(pvVar7 + 0x28) == (byte *)0x0) || ((**(byte **)(pvVar7 + 0x28) & 1) != 0))
          goto LAB_006738c7;
        }
        else {
LAB_006738c7:
          duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_880);
          pvVar7 = vector<duckdb::Vector,_true>::operator[]
                             ((vector<duckdb::Vector,_true> *)this,sVar12);
          duckdb::Vector::ToUnifiedFormat((ulong)pvVar7,*(UnifiedVectorFormat **)(this + 0x18));
          lVar2 = local_878;
          uVar11 = *(ulong *)(this + 0x18);
          if (local_870 == 0) {
            if (uVar11 != 0) {
              uVar11 = 0;
              psVar9 = psVar4;
              do {
                uVar10 = uVar11;
                if (*local_880 != 0) {
                  uVar10 = (ulong)*(uint *)(*local_880 + uVar11 * 4);
                }
                puVar1 = (undefined8 *)(lVar2 + uVar10 * 0x10);
                local_8a8._0_8_ = *puVar1;
                local_8a8.pointer.ptr = (char *)puVar1[1];
                if ((*(char *)((long)&local_838[0].ptr + uVar11) != '\x01') ||
                   (bVar6 = string_t::StringComparisonOperators::GreaterThan
                                      (psVar9,(string_t *)&local_8a8.pointer), bVar6)) {
                  *(undefined1 *)((long)&local_838[0].ptr + uVar11) = 1;
                  *(undefined8 *)&psVar9->value = local_8a8._0_8_;
                  (psVar9->value).pointer.ptr = local_8a8.pointer.ptr;
                }
                uVar11 = uVar11 + 1;
                psVar9 = psVar9 + 1;
              } while (uVar11 < *(ulong *)(this + 0x18));
            }
          }
          else if (uVar11 != 0) {
            uVar10 = 0;
            psVar9 = psVar4;
            do {
              uVar8 = uVar10;
              if (*local_880 != 0) {
                uVar8 = (ulong)*(uint *)(*local_880 + uVar10 * 4);
              }
              if ((local_870 == 0) ||
                 ((*(ulong *)(local_870 + (uVar8 >> 6) * 8) >> (uVar8 & 0x3f) & 1) != 0)) {
                puVar1 = (undefined8 *)(lVar2 + uVar8 * 0x10);
                local_8a8._0_8_ = *puVar1;
                local_8a8.pointer.ptr = (char *)puVar1[1];
                if ((*(char *)((long)&local_838[0].ptr + uVar10) != '\x01') ||
                   (bVar6 = string_t::StringComparisonOperators::GreaterThan
                                      (psVar9,(string_t *)&local_8a8.pointer), bVar6)) {
                  *(undefined1 *)((long)&local_838[0].ptr + uVar10) = 1;
                  *(undefined8 *)&psVar9->value = local_8a8._0_8_;
                  (psVar9->value).pointer.ptr = local_8a8.pointer.ptr;
                }
                uVar11 = *(ulong *)(this + 0x18);
              }
              uVar10 = uVar10 + 1;
              psVar9 = psVar9 + 1;
            } while (uVar10 < uVar11);
          }
          if (local_840 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_840);
          }
          if (local_860 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_860);
          }
        }
        sVar12 = sVar12 + 1;
        result = local_890;
      } while (sVar12 < (ulong)((*(long *)(this + 8) - *(long *)this >> 3) * 0x4ec4ec4ec4ec4ec5));
    }
  }
  SortKeyLeastGreatest::FinalizeResult(*(idx_t *)(this + 0x18),(bool *)local_838,result,local_888);
  duckdb::Vector::SetVectorType((VectorType)result);
  return;
}

Assistant:

static void LeastGreatestFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	if (args.ColumnCount() == 1) {
		// single input: nop
		result.Reference(args.data[0]);
		return;
	}
	auto &input = BASE_OP::Prepare(args, state);
	auto &result_vector = BASE_OP::TargetVector(result, state);

	auto result_type = VectorType::CONSTANT_VECTOR;
	for (idx_t col_idx = 0; col_idx < input.ColumnCount(); col_idx++) {
		if (args.data[col_idx].GetVectorType() != VectorType::CONSTANT_VECTOR) {
			// non-constant input: result is not a constant vector
			result_type = VectorType::FLAT_VECTOR;
		}
		if (BASE_OP::IS_STRING) {
			// for string vectors we add a reference to the heap of the children
			StringVector::AddHeapReference(result_vector, input.data[col_idx]);
		}
	}

	auto result_data = FlatVector::GetData<T>(result_vector);
	bool result_has_value[STANDARD_VECTOR_SIZE] {false};
	// perform the operation column-by-column
	for (idx_t col_idx = 0; col_idx < input.ColumnCount(); col_idx++) {
		if (input.data[col_idx].GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    ConstantVector::IsNull(input.data[col_idx])) {
			// ignore null vector
			continue;
		}

		UnifiedVectorFormat vdata;
		input.data[col_idx].ToUnifiedFormat(input.size(), vdata);

		auto input_data = UnifiedVectorFormat::GetData<T>(vdata);
		if (!vdata.validity.AllValid()) {
			// potential new null entries: have to check the null mask
			for (idx_t i = 0; i < input.size(); i++) {
				auto vindex = vdata.sel->get_index(i);
				if (vdata.validity.RowIsValid(vindex)) {
					// not a null entry: perform the operation and add to new set
					auto ivalue = input_data[vindex];
					if (!result_has_value[i] || OP::template Operation<T>(ivalue, result_data[i])) {
						result_has_value[i] = true;
						result_data[i] = ivalue;
					}
				}
			}
		} else {
			// no new null entries: only need to perform the operation
			for (idx_t i = 0; i < input.size(); i++) {
				auto vindex = vdata.sel->get_index(i);

				auto ivalue = input_data[vindex];
				if (!result_has_value[i] || OP::template Operation<T>(ivalue, result_data[i])) {
					result_has_value[i] = true;
					result_data[i] = ivalue;
				}
			}
		}
	}
	BASE_OP::FinalizeResult(input.size(), result_has_value, result, state);
	result.SetVectorType(result_type);
}